

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal_test.c
# Opt level: O1

uint main(void)

{
  ulong uVar1;
  uint i;
  undefined8 *puVar2;
  int *piVar3;
  long lVar4;
  uint *puVar5;
  uint *G_00;
  uint *__ptr;
  int *__ptr_00;
  int *__ptr_01;
  int *__ptr_02;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint G [2];
  ulong local_30;
  
  generate_gf();
  puVar2 = (undefined8 *)calloc(5,4);
  *puVar2 = 0xe700000074;
  puVar2[1] = 0x1e000000d8;
  *(undefined4 *)(puVar2 + 2) = 1;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 4) break;
    uVar1 = uVar6 + 1;
  } while ((&DAT_00104144)[uVar6] == *(int *)((long)puVar2 + uVar6 * 4 + 4));
  REQUIRE((uint)(3 < uVar6));
  REQUIRE(1);
  free(puVar2);
  local_30 = 0x100000002;
  puVar2 = (undefined8 *)calloc(2,4);
  *puVar2 = 0x100000002;
  lVar4 = 4;
  do {
    lVar9 = lVar4;
    if (lVar9 == 8) break;
    lVar4 = lVar9 + 4;
  } while (*(int *)((long)&local_30 + lVar9) == *(int *)((long)puVar2 + lVar9));
  REQUIRE((uint)(lVar9 != 4));
  REQUIRE(1);
  free(puVar2);
  piVar3 = (int *)calloc(6,4);
  lVar4 = 0;
  do {
    piVar3[lVar4 + 4] = (uint)(byte)"hi"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  uVar7 = 0;
  if (*piVar3 == 0) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 5) break;
      uVar1 = uVar6 + 1;
    } while ((&DAT_00104164)[uVar6] == piVar3[uVar6 + 1]);
    uVar7 = (uint)(4 < uVar6);
  }
  REQUIRE(uVar7);
  free(piVar3);
  piVar3 = (int *)calloc(4,4);
  lVar4 = 0;
  do {
    piVar3[lVar4 + 2] = (uint)(byte)"hi"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  uVar7 = 0;
  if (*piVar3 == 0) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 3) break;
      uVar1 = uVar6 + 1;
    } while ((&DAT_00104024)[uVar6] == piVar3[uVar6 + 1]);
    uVar7 = (uint)(2 < uVar6);
  }
  REQUIRE(uVar7);
  free(piVar3);
  puVar5 = (uint *)calloc(6,4);
  lVar4 = 0;
  do {
    puVar5[lVar4 + 4] = (uint)(byte)"hi"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  G_00 = (uint *)calloc(5,4);
  G_00[0] = 0x74;
  G_00[1] = 0xe7;
  G_00[2] = 0xd8;
  G_00[3] = 0x1e;
  G_00[4] = 1;
  local_30 = local_30 & 0xffffffff00000000;
  __ptr = calculate_check_symbols(puVar5,6,G_00,5,2,(uint *)&local_30);
  uVar7 = 0;
  uVar8 = 0;
  if (*__ptr == 0x45) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 5) break;
      uVar1 = uVar6 + 1;
    } while ((&DAT_00104184)[uVar6] == __ptr[uVar6 + 1]);
    uVar8 = (uint)(4 < uVar6);
  }
  REQUIRE(uVar8);
  free(G_00);
  free(__ptr);
  free(puVar5);
  local_30 = local_30 & 0xffffffff00000000;
  puVar5 = calculate_syndrome((uint *)&DAT_001041a0,6,2,(uint *)&local_30);
  if (*puVar5 == 0x82) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 3) break;
      uVar1 = uVar6 + 1;
    } while (puVar5[uVar6 + 1] == (&DAT_00104034)[uVar6]);
    uVar7 = (uint)(2 < uVar6);
  }
  REQUIRE(uVar7);
  REQUIRE((uint)((int)local_30 == 4));
  free(puVar5);
  piVar3 = (int *)calloc(5,4);
  piVar3[0] = 0x74;
  piVar3[1] = 0xe7;
  piVar3[2] = 0xd8;
  piVar3[3] = 0x1e;
  piVar3[4] = 1;
  __ptr_00 = (int *)calloc(5,4);
  __ptr_00[0] = 0x74;
  __ptr_00[1] = 0xe7;
  __ptr_00[2] = 0xd8;
  __ptr_00[3] = 0x1e;
  __ptr_00[4] = 1;
  __ptr_01 = (int *)calloc(5,4);
  __ptr_01[0] = 0x74;
  __ptr_01[1] = 0xe7;
  __ptr_01[2] = 0xd8;
  __ptr_01[3] = 0x1e;
  __ptr_01[4] = 1;
  __ptr_02 = (int *)calloc(5,4);
  __ptr_02[0] = 0x74;
  __ptr_02[1] = 0xe7;
  __ptr_02[2] = 0xd8;
  __ptr_02[3] = 0x1e;
  __ptr_02[4] = 1;
  uVar7 = 0;
  uVar8 = 0;
  if (*piVar3 == *__ptr_00) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 4) break;
      uVar1 = uVar6 + 1;
    } while (piVar3[uVar6 + 1] == __ptr_00[uVar6 + 1]);
    uVar8 = (uint)(3 < uVar6);
  }
  REQUIRE(uVar8);
  if (*__ptr_00 == *__ptr_01) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 4) break;
      uVar1 = uVar6 + 1;
    } while (__ptr_00[uVar6 + 1] == __ptr_01[uVar6 + 1]);
    uVar7 = (uint)(3 < uVar6);
  }
  REQUIRE(uVar7);
  uVar7 = 0;
  uVar8 = 0;
  if (*__ptr_01 == *__ptr_02) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 4) break;
      uVar1 = uVar6 + 1;
    } while (__ptr_01[uVar6 + 1] == __ptr_02[uVar6 + 1]);
    uVar8 = (uint)(3 < uVar6);
  }
  REQUIRE(uVar8);
  if (*__ptr_02 == *piVar3) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (uVar6 == 4) break;
      uVar1 = uVar6 + 1;
    } while (__ptr_02[uVar6 + 1] == piVar3[uVar6 + 1]);
    uVar7 = (uint)(3 < uVar6);
  }
  REQUIRE(uVar7);
  free(piVar3);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  return total;
}

Assistant:

uint32_t main()
{
    generate_gf();

    { // generating_polynomial_test t=2
        uint32_t t = 2;
        uint32_t G[] = {116, 231, 216, 30, 1};
        uint32_t g_len = 0;
        uint32_t *g = generating_polynomial(t, &g_len);
        REQUIRE(AR_EQ(G, g, LEN(G)));
        REQUIRE(g_len == LEN(G));
        vector_free(g);
    }

    { // generating_polynomial_test t=1
        uint32_t t = 1;
        uint32_t G[] = {2, 1};
        uint32_t g_len = 0;
        uint32_t *g = generating_polynomial(t, &g_len);
        REQUIRE(AR_EQ(G, g, LEN(G)));
        REQUIRE(g_len == LEN(G));
        vector_free(g);
    }

    { // shift_msg_to_vec t=2
        uint32_t t = 2;
        uint32_t a[] = {0, 0, 0, 0, 104, 105};
        uint32_t b_len = 0;
        uint32_t *b = shift_msg_to_vec("hi", 2, t, &b_len);
        REQUIRE(AR_EQ(a, b, LEN(a)));
        vector_free(b);
    }

    { // shift_msg_to_vec t=1
        uint32_t t = 1;
        uint32_t a[] = {0, 0, 104, 105};
        uint32_t b_len = 0;
        uint32_t *b = shift_msg_to_vec("hi", 2, t, &b_len);
        REQUIRE(AR_EQ(a, b, LEN(a)));
        vector_free(b);
    }

    { // calculate_check_symbols t=2
        uint32_t t = 2;
        uint32_t v[] = {69, 211, 228, 205, 0, 0};
        uint32_t m_len = 0;
        uint32_t *M = shift_msg_to_vec("hi", 2, t, &m_len);
        uint32_t g_len = 0;
        uint32_t *G = generating_polynomial(t, &g_len);
        uint32_t a_len = 0;
        uint32_t *a = calculate_check_symbols(M, m_len, G, g_len, t, &a_len);
        REQUIRE(AR_EQ(v, a, LEN(v)));
        vector_free(G);
        vector_free(a);
        vector_free(M);
    }

    { // calculate syndrome test
        uint32_t t = 2;
        uint32_t expected[] = {130, 153, 245, 88};
        uint32_t c1[] = {192, 211, 44, 205, 104, 105};
        uint32_t actual_len = 0;
        uint32_t *actual = calculate_syndrome(c1, LEN(c1), t, &actual_len);
        REQUIRE(AR_EQ(actual, expected, LEN(expected)));
        REQUIRE(actual_len == LEN(expected));
        vector_free(actual);
    }

    { // generator test
        uint32_t t = 2;
        uint32_t size = 0;
        uint32_t *q = generating_polynomial(t, &size);
        uint32_t *w = generating_polynomial(t, NULL);
        uint32_t *e = generating_polynomial(t, NULL);
        uint32_t *r = generating_polynomial(t, NULL);

        REQUIRE(AR_EQ(q,w,size));
        REQUIRE(AR_EQ(w,e,size));
        REQUIRE(AR_EQ(e,r,size));
        REQUIRE(AR_EQ(r,q,size));

        vector_free(q);
        vector_free(w);
        vector_free(e);
        vector_free(r);
    }

    TEST_EXIT;
}